

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::read_crn_from_memory
          (mipmapped_texture *this,void *pData,uint data_size,char *pFilename)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vector<crnlib::mip_level_*> *pvVar5;
  mip_level *pmVar6;
  mip_level **ppmVar7;
  crnd_unpack_context pContext_00;
  uchar *puVar8;
  dynamic_string local_138;
  uint local_128;
  uint local_124;
  uint l_4;
  uint f_6;
  dxt_image *pDXT_image;
  uint f_5;
  uint l_3;
  uint f_4;
  uint f_3;
  uint size_of_face;
  uint row_pitch;
  uint num_blocks_y;
  uint num_blocks_x;
  uint level_height;
  uint level_width;
  uint l_2;
  uint f_2;
  void *pFaces [6];
  uint total_pixels;
  uint local_ac;
  uint l_1;
  uint f_1;
  crnd_unpack_context pContext;
  vector<unsigned_char> dxt_data;
  uint tex_num_blocks_y;
  uint tex_num_blocks_x;
  uint l;
  uint local_74;
  undefined1 local_70 [4];
  uint f;
  face_vec faces;
  dxt_format dxt_fmt;
  pixel_format dds_fmt;
  crn_texture_info tex_info;
  char *pFilename_local;
  uint data_size_local;
  void *pData_local;
  mipmapped_texture *this_local;
  
  tex_info.m_format = (crn_format)pFilename;
  clear(this);
  set_last_error(this,"Image file load failed");
  if ((pData == (void *)0x0) || (data_size == 0)) {
    this_local._7_1_ = false;
  }
  else {
    crnd::crn_texture_info::crn_texture_info((crn_texture_info *)&dxt_fmt);
    dxt_fmt = 0x28;
    bVar1 = crnd::crnd_get_texture_info(pData,data_size,(crn_texture_info *)&dxt_fmt);
    if (bVar1) {
      faces.m_capacity = crnd::crnd_crn_format_to_fourcc(tex_info._24_8_);
      if (faces.m_capacity == PIXEL_FMT_INVALID) {
        set_last_error(this,"Unsupported DXT format");
        this_local._7_1_ = false;
      }
      else {
        faces.m_size = pixel_format_helpers::get_dxt_format(faces.m_capacity);
        vector<crnlib::vector<crnlib::mip_level_*>_>::vector
                  ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70,tex_info.m_height);
        for (local_74 = 0; local_74 < tex_info.m_height; local_74 = local_74 + 1) {
          pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70,local_74);
          vector<crnlib::mip_level_*>::resize(pvVar5,tex_info.m_width,false);
          for (tex_num_blocks_y = 0; tex_num_blocks_y < tex_info.m_width;
              tex_num_blocks_y = tex_num_blocks_y + 1) {
            pmVar6 = crnlib_new<crnlib::mip_level>();
            pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                               ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70,local_74);
            ppmVar7 = vector<crnlib::mip_level_*>::operator[](pvVar5,tex_num_blocks_y);
            *ppmVar7 = pmVar6;
          }
        }
        dxt_data.m_capacity = dds_fmt + 3 >> 2;
        dxt_data.m_size = tex_info.m_struct_size + 3 >> 2;
        vector<unsigned_char>::vector((vector<unsigned_char> *)&pContext);
        vector<unsigned_char>::resize
                  ((vector<unsigned_char> *)&pContext,
                   tex_info.m_levels * dxt_data.m_capacity * dxt_data.m_size * tex_info.m_height,
                   false);
        set_last_error(this,"CRN unpack failed");
        pContext_00 = crnd::crnd_unpack_begin(pData,data_size);
        if (pContext_00 != (crnd_unpack_context)0x0) {
          pFaces[5]._0_4_ = 0;
          for (level_width = tex_info.m_height; level_width < 6; level_width = level_width + 1) {
            (&l_2 + (ulong)level_width * 2)[0] = 0;
            (&l_2 + (ulong)level_width * 2)[1] = 0;
          }
          level_height = 0;
LAB_00150f91:
          if (level_height < tex_info.m_width) {
            num_blocks_x = math::maximum<unsigned_int>(1,dds_fmt >> ((byte)level_height & 0x1f));
            num_blocks_y = math::maximum<unsigned_int>
                                     (1,tex_info.m_struct_size >> ((byte)level_height & 0x1f));
            row_pitch = num_blocks_x + 3 >> 2;
            size_of_face = num_blocks_y + 3 >> 2;
            f_3 = row_pitch * tex_info.m_levels;
            f_4 = size_of_face * f_3;
            pFaces[5]._0_4_ = row_pitch * size_of_face * 0x10 * tex_info.m_height + (int)pFaces[5];
            for (l_3 = 0; l_3 < tex_info.m_height; l_3 = l_3 + 1) {
              puVar8 = vector<unsigned_char>::operator[]
                                 ((vector<unsigned_char> *)&pContext,l_3 * f_4);
              *(uchar **)(&l_2 + (ulong)l_3 * 2) = puVar8;
            }
            uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)&pContext);
            bVar1 = crnd::crnd_unpack_level(pContext_00,(void **)&l_2,uVar2,f_3,level_height);
            if (bVar1) goto LAB_00151247;
            crnd::crnd_unpack_end(pContext_00);
            f_5 = 0;
            while( true ) {
              uVar2 = f_5;
              uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                                ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70);
              if (uVar3 <= uVar2) break;
              pDXT_image._4_4_ = 0;
              while( true ) {
                uVar4 = pDXT_image._4_4_;
                pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                                   ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70,f_5);
                uVar2 = vector<crnlib::mip_level_*>::size(pvVar5);
                if (uVar2 <= uVar4) break;
                pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                                   ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70,f_5);
                ppmVar7 = vector<crnlib::mip_level_*>::operator[](pvVar5,pDXT_image._4_4_);
                crnlib_delete<crnlib::mip_level>(*ppmVar7);
                pDXT_image._4_4_ = pDXT_image._4_4_ + 1;
              }
              f_5 = f_5 + 1;
            }
            this_local._7_1_ = false;
          }
          else {
            crnd::crnd_unpack_end(pContext_00);
            assign(this,(face_vec *)local_70);
            dynamic_string::dynamic_string(&local_138,(char *)tex_info.m_format);
            set_name(this,&local_138);
            dynamic_string::~dynamic_string(&local_138);
            this->m_source_file_type = cFormatCRN;
            clear_last_error(this);
            this_local._7_1_ = true;
          }
          goto LAB_0015151b;
        }
        local_ac = 0;
        while( true ) {
          uVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                            ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70);
          if (uVar2 <= local_ac) break;
          total_pixels = 0;
          while( true ) {
            pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                               ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70,local_ac);
            uVar2 = vector<crnlib::mip_level_*>::size(pvVar5);
            if (uVar2 <= total_pixels) break;
            pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                               ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70,local_ac);
            ppmVar7 = vector<crnlib::mip_level_*>::operator[](pvVar5,total_pixels);
            crnlib_delete<crnlib::mip_level>(*ppmVar7);
            total_pixels = total_pixels + 1;
          }
          local_ac = local_ac + 1;
        }
        this_local._7_1_ = false;
LAB_0015151b:
        pFaces[5]._4_4_ = 1;
        vector<unsigned_char>::~vector((vector<unsigned_char> *)&pContext);
        vector<crnlib::vector<crnlib::mip_level_*>_>::~vector
                  ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70);
      }
    }
    else {
      set_last_error(this,"crnd_get_texture_info() failed");
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
LAB_00151247:
  pDXT_image._0_4_ = 0;
LAB_00151251:
  if ((uint)pDXT_image < tex_info.m_height) {
    _l_4 = crnlib_new<crnlib::dxt_image>();
    uVar4 = dxt_image::init(_l_4,(EVP_PKEY_CTX *)(ulong)faces.m_size);
    if ((uVar4 & 1) != 0) goto LAB_0015140d;
    crnlib_delete<crnlib::dxt_image>(_l_4);
    crnd::crnd_unpack_end(pContext_00);
    local_124 = 0;
    while( true ) {
      uVar4 = local_124;
      uVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                        ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70);
      if (uVar2 <= uVar4) break;
      local_128 = 0;
      while( true ) {
        uVar4 = local_128;
        pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                           ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70,local_124);
        uVar2 = vector<crnlib::mip_level_*>::size(pvVar5);
        if (uVar2 <= uVar4) break;
        pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                           ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70,local_124);
        ppmVar7 = vector<crnlib::mip_level_*>::operator[](pvVar5,local_128);
        crnlib_delete<crnlib::mip_level>(*ppmVar7);
        local_128 = local_128 + 1;
      }
      local_124 = local_124 + 1;
    }
    this_local._7_1_ = false;
    goto LAB_0015151b;
  }
  level_height = level_height + 1;
  goto LAB_00150f91;
LAB_0015140d:
  pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                     ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_70,(uint)pDXT_image);
  ppmVar7 = vector<crnlib::mip_level_*>::operator[](pvVar5,level_height);
  mip_level::assign(*ppmVar7,_l_4,faces.m_capacity,cDefaultOrientationFlags);
  pDXT_image._0_4_ = (uint)pDXT_image + 1;
  goto LAB_00151251;
}

Assistant:

bool mipmapped_texture::read_crn_from_memory(const void* pData, uint data_size, const char* pFilename) {
  clear();

  set_last_error("Image file load failed");

  if ((!pData) || (data_size < 1))
    return false;

  crnd::crn_texture_info tex_info;
  tex_info.m_struct_size = sizeof(crnd::crn_texture_info);
  if (!crnd_get_texture_info(pData, data_size, &tex_info)) {
    set_last_error("crnd_get_texture_info() failed");
    return false;
  }

  const pixel_format dds_fmt = (pixel_format)crnd::crnd_crn_format_to_fourcc(tex_info.m_format);
  if (dds_fmt == PIXEL_FMT_INVALID) {
    set_last_error("Unsupported DXT format");
    return false;
  }

  const dxt_format dxt_fmt = pixel_format_helpers::get_dxt_format(dds_fmt);

  face_vec faces(tex_info.m_faces);
  for (uint f = 0; f < tex_info.m_faces; f++) {
    faces[f].resize(tex_info.m_levels);

    for (uint l = 0; l < tex_info.m_levels; l++)
      faces[f][l] = crnlib_new<mip_level>();
  }

  const uint tex_num_blocks_x = (tex_info.m_width + 3) >> 2;
  const uint tex_num_blocks_y = (tex_info.m_height + 3) >> 2;

  vector<uint8> dxt_data;
  // Create temp buffer big enough to hold the largest mip level, and all faces if it's a cubemap.
  dxt_data.resize(tex_info.m_bytes_per_block * tex_num_blocks_x * tex_num_blocks_y * tex_info.m_faces);

  set_last_error("CRN unpack failed");

#if 0
      timer t;
      double total_time = 0.0f;
      t.start();
#endif

  crnd::crnd_unpack_context pContext = crnd::crnd_unpack_begin(pData, data_size);

#if 0
      total_time += t.get_elapsed_secs();
#endif

  if (!pContext) {
    for (uint f = 0; f < faces.size(); f++)
      for (uint l = 0; l < faces[f].size(); l++)
        crnlib_delete(faces[f][l]);
    return false;
  }

  uint total_pixels = 0;

  void* pFaces[cCRNMaxFaces];
  for (uint f = tex_info.m_faces; f < cCRNMaxFaces; f++)
    pFaces[f] = nullptr;

  for (uint l = 0; l < tex_info.m_levels; l++) {
    const uint level_width = math::maximum<uint>(1U, tex_info.m_width >> l);
    const uint level_height = math::maximum<uint>(1U, tex_info.m_height >> l);
    const uint num_blocks_x = (level_width + 3U) >> 2U;
    const uint num_blocks_y = (level_height + 3U) >> 2U;

    const uint row_pitch = num_blocks_x * tex_info.m_bytes_per_block;
    const uint size_of_face = num_blocks_y * row_pitch;

    total_pixels += num_blocks_x * num_blocks_y * 4 * 4 * tex_info.m_faces;

#if 0
         t.start();
#endif

    for (uint f = 0; f < tex_info.m_faces; f++)
      pFaces[f] = &dxt_data[f * size_of_face];

    if (!crnd::crnd_unpack_level(pContext, pFaces, dxt_data.size(), row_pitch, l)) {
      crnd::crnd_unpack_end(pContext);
      for (uint f = 0; f < faces.size(); f++)
        for (uint l = 0; l < faces[f].size(); l++)
          crnlib_delete(faces[f][l]);
      return false;
    }

#if 0
         total_time += t.get_elapsed_secs();
#endif

    for (uint f = 0; f < tex_info.m_faces; f++) {
      dxt_image* pDXT_image = crnlib_new<dxt_image>();

      if (!pDXT_image->init(
              dxt_fmt, level_width, level_height,
              num_blocks_x * num_blocks_y * (tex_info.m_bytes_per_block / sizeof(dxt_image::element)),
              reinterpret_cast<dxt_image::element*>(pFaces[f]), true)) {
        crnlib_delete(pDXT_image);

        crnd::crnd_unpack_end(pContext);
        for (uint f = 0; f < faces.size(); f++)
          for (uint l = 0; l < faces[f].size(); l++)
            crnlib_delete(faces[f][l]);

        return false;
      }

      faces[f][l]->assign(pDXT_image, dds_fmt);
    }
  }

#if 0
      if (total_pixels)
      {
         console::info("read_crn_from_memory: Total pixels: %u, ms: %3.3fms, megapixels/sec: %3.3f",
            total_pixels, total_time * 1000.0f, total_pixels / total_time);
      }
#endif

  crnd::crnd_unpack_end(pContext);

  assign(faces);
  set_name(pFilename);

  m_source_file_type = texture_file_types::cFormatCRN;
  clear_last_error();

  return true;
}